

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O1

bool __thiscall SightCheck::PTR_SightTraverse(SightCheck *this,intercept_t *in)

{
  F3DFloor **ppFVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  line_t_conflict *linedef;
  extsector_t *peVar6;
  F3DFloor *pFVar7;
  secplane_t *psVar8;
  secplane_t *psVar9;
  undefined8 *puVar10;
  double *pdVar11;
  double *pdVar12;
  double dVar13;
  SightTask *pSVar14;
  bool bVar15;
  sector_t_conflict **ppsVar16;
  ulong uVar17;
  sector_t_conflict *psVar18;
  byte bVar19;
  int iVar20;
  byte bVar21;
  uint uVar22;
  F3DFloor **ppFVar23;
  long lVar24;
  FLinePortal *pFVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  SightOpening open;
  SightOpening local_48;
  
  linedef = (in->d).line;
  if (((i_compatflags._1_1_ & 0x20) == 0) || (linedef->frontsector != linedef->backsector)) {
    dVar28 = in->frac;
    dVar13 = (this->Trace).dx * dVar28 + (this->Trace).x;
    dVar26 = (this->Trace).dy * dVar28 + (this->Trace).y;
    P_SightOpening(this,&local_48,linedef,dVar13,dVar26);
    pFVar25 = (FLinePortal *)0x0;
    if (linedef->portalindex < linePortals.Count) {
      pFVar25 = linePortals.Array + linedef->portalindex;
    }
    if ((local_48.range != 0 || local_48.portalflags != 0) ||
       ((pFVar25 != (FLinePortal *)0x0 && (pFVar25->mType == '\x03')))) {
      if ((dVar28 == 0.0) && (!NAN(dVar28))) {
        return true;
      }
      if ((-3.4028234663852886e+38 < local_48.bottom) &&
         (dVar27 = (local_48.bottom - (this->sightstart).Z) / dVar28,
         this->bottomslope <= dVar27 && dVar27 != this->bottomslope)) {
        this->bottomslope = dVar27;
      }
      if ((local_48.top < 3.4028234663852886e+38) &&
         (dVar27 = (local_48.top - (this->sightstart).Z) / dVar28, dVar27 < this->topslope)) {
        this->topslope = dVar27;
      }
      if (local_48.portalflags == 0) {
        uVar22 = 0xffffffff;
      }
      else {
        dVar27 = ((linedef->v1->p).X - (this->sightstart).X) * (linedef->delta).Y +
                 ((this->sightstart).Y - (linedef->v1->p).Y) * (linedef->delta).X;
        psVar18 = linedef->backsector;
        if (1.52587890625e-05 < dVar27) {
          if (psVar18 == (sector_t_conflict *)0x0) goto LAB_00450099;
          psVar18 = linedef->frontsector;
          local_48.portalflags =
               ((uint)local_48.portalflags >> 1 & 5) + (local_48.portalflags & 5U) * 2;
        }
        if ((this->portaldir != 0) && ((local_48.portalflags & 3U) == 2)) {
          dVar2 = this->topslope;
          dVar3 = this->bottomslope;
          iVar20 = (sectorPortals.Array[psVar18->Portals[1]].mDestination)->PortalGroup;
          TArray<SightTask,_SightTask>::Grow(&portals,1);
          pSVar14 = portals.Array;
          uVar17 = (ulong)portals.Count;
          portals.Array[uVar17].Frac = dVar28;
          pSVar14[uVar17].topslope = dVar2;
          (&pSVar14[uVar17].topslope)[1] = dVar3;
          pSVar14[uVar17].direction = 1;
          pSVar14[uVar17].portalgroup = iVar20;
          portals.Count = portals.Count + 1;
        }
        uVar22 = (uint)(1.52587890625e-05 < dVar27);
        if ((this->portaldir != 1) && ((local_48.portalflags & 0xcU) == 8)) {
          dVar28 = in->frac;
          dVar27 = this->topslope;
          dVar2 = this->bottomslope;
          iVar20 = (sectorPortals.Array[psVar18->Portals[0]].mDestination)->PortalGroup;
          TArray<SightTask,_SightTask>::Grow(&portals,1);
          pSVar14 = portals.Array;
          uVar17 = (ulong)portals.Count;
          portals.Array[uVar17].Frac = dVar28;
          pSVar14[uVar17].topslope = dVar27;
          (&pSVar14[uVar17].topslope)[1] = dVar2;
          pSVar14[uVar17].direction = 0;
          pSVar14[uVar17].portalgroup = iVar20;
          portals.Count = portals.Count + 1;
        }
      }
      if (pFVar25 == (FLinePortal *)0x0) {
        if (local_48.range == 0) {
          return false;
        }
        if (this->topslope <= this->bottomslope) {
          return false;
        }
        if (((linedef->frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count ==
             0) && ((linedef->backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                    Count == 0)) {
          psVar18 = (sector_t_conflict *)0x0;
        }
        else {
          if (uVar22 == 0xffffffff) {
            uVar22 = (uint)(1.52587890625e-05 <
                           ((linedef->v1->p).X - (this->sightstart).X) * (linedef->delta).Y +
                           ((this->sightstart).Y - (linedef->v1->p).Y) * (linedef->delta).X);
          }
          dVar28 = this->topslope;
          dVar27 = this->bottomslope;
          dVar2 = in->frac;
          dVar3 = (this->sightstart).Z;
          iVar20 = 1;
          do {
            ppsVar16 = &linedef->backsector;
            if (iVar20 == 1) {
              ppsVar16 = &linedef->frontsector;
            }
            psVar18 = *ppsVar16;
            peVar6 = psVar18->e;
            uVar17 = (ulong)(peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            bVar21 = 5;
            if (uVar17 != 0) {
              dVar29 = dVar28 * dVar2;
              dVar30 = dVar2 * dVar27;
              ppFVar23 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
              ppsVar16 = &linedef->backsector;
              if (iVar20 == 2) {
                ppsVar16 = &linedef->frontsector;
              }
              ppFVar1 = ppFVar23 + uVar17;
              dVar31 = dVar27;
              do {
                pFVar7 = *ppFVar23;
                uVar5 = pFVar7->flags;
                bVar21 = 6;
                if (((uVar5 & 1) != 0 && (uVar5 & 0x2000000) != this->myseethrough) &&
                   (bVar19 = (byte)((this->Flags & 8U) >> 3), ((uVar5 & 2) == 0 & bVar19) == 0)) {
                  psVar8 = (pFVar7->bottom).plane;
                  psVar9 = (pFVar7->top).plane;
                  dVar34 = ((psVar8->normal).Y * dVar26 + (psVar8->normal).X * dVar13 + psVar8->D) *
                           psVar8->negiC;
                  dVar33 = ((psVar9->normal).Y * dVar26 + (psVar9->normal).X * dVar13 + psVar9->D) *
                           psVar9->negiC;
                  dVar32 = (dVar33 - dVar3) / dVar2;
                  dVar35 = (dVar34 - dVar3) / dVar2;
                  if (dVar28 <= dVar32) {
                    bVar21 = 1;
                    if (dVar35 <= dVar31) goto LAB_00450499;
                    if (dVar35 < dVar28) {
                      this->topslope = dVar35;
                      dVar28 = dVar35;
                    }
                  }
                  else if (dVar35 <= dVar31) {
                    if (dVar31 < dVar32) {
                      this->bottomslope = dVar32;
                      dVar27 = dVar32;
                      dVar31 = dVar32;
                    }
                  }
                  else {
                    uVar17 = (ulong)((*ppsVar16)->e->XFloor).ffloors.
                                    super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                    if (uVar17 != 0) {
                      lVar24 = 0;
                      do {
                        puVar10 = *(undefined8 **)
                                   ((long)((*ppsVar16)->e->XFloor).ffloors.
                                          super_TArray<F3DFloor_*,_F3DFloor_*>.Array + lVar24);
                        bVar21 = 8;
                        if (((*(uint *)(puVar10 + 0xb) & 1) != 0 && (bVar19 & (uVar5 & 2) == 0) == 0
                            ) && (*(uint *)(puVar10 + 0xb) & 0x2000000) != this->myseethrough) {
                          pdVar11 = (double *)*puVar10;
                          pdVar12 = (double *)puVar10[5];
                          dVar36 = (pdVar11[1] * dVar26 + *pdVar11 * dVar13 + pdVar11[3]) *
                                   pdVar11[4];
                          dVar37 = (pdVar12[1] * dVar26 + *pdVar12 * dVar13 + pdVar12[3]) *
                                   pdVar12[4];
                          bVar21 = 1;
                          if ((((dVar36 < dVar34) || (dVar33 < dVar36)) &&
                              ((dVar33 < dVar37 || (dVar37 < dVar34)))) &&
                             ((dVar34 < dVar36 || (dVar37 < dVar33)))) {
                            bVar21 = -(dVar34 <= dVar36 && dVar37 <= dVar33) & 1;
                          }
                        }
                        if ((bVar21 & 7) != 0) goto LAB_004503ec;
                        lVar24 = lVar24 + 8;
                      } while (uVar17 << 3 != lVar24);
                    }
                    bVar21 = 7;
LAB_004503ec:
                    if (bVar21 == 7) {
                      bVar21 = 0;
                    }
                    if (bVar21 != 0) goto LAB_00450499;
                  }
                  if (uVar22 == iVar20 - 1U && psVar18 == this->lastsector) {
                    if ((this->Lastztop <= dVar34) && (dVar33 < dVar29 + dVar3)) {
                      this->topslope = dVar35;
                      dVar28 = dVar35;
                    }
                    if ((dVar33 <= this->Lastzbottom) && (dVar30 + dVar3 < dVar33)) {
                      this->bottomslope = dVar32;
                      dVar31 = dVar32;
                      dVar27 = dVar32;
                    }
                  }
                  bVar21 = dVar28 <= dVar31;
                }
LAB_00450499:
              } while (((bVar21 == 6) || (bVar21 == 0)) &&
                      (ppFVar23 = ppFVar23 + 1, bVar21 = 5, ppFVar23 != ppFVar1));
            }
            if (bVar21 == 5) {
              bVar21 = 0;
            }
            if (bVar21 != 0) goto LAB_004504ea;
            iVar20 = iVar20 + 1;
          } while (iVar20 != 3);
          bVar21 = 2;
LAB_004504ea:
          if (bVar21 != 2) goto LAB_00450099;
          psVar18 = (sector_t_conflict *)linedef->bbox[(ulong)(uVar22 == 0) + 4];
        }
        this->lastsector = psVar18;
        dVar28 = in->frac;
        dVar13 = (this->sightstart).Z;
        this->Lastztop = this->topslope * dVar28 + dVar13;
        this->Lastzbottom = dVar28 * this->bottomslope + dVar13;
        goto LAB_00450537;
      }
      dVar28 = in->frac;
      dVar13 = this->topslope;
      dVar26 = this->bottomslope;
      iVar20 = this->portaldir;
      iVar4 = pFVar25->mDestination->frontsector->PortalGroup;
      TArray<SightTask,_SightTask>::Grow(&portals,1);
      pSVar14 = portals.Array;
      uVar17 = (ulong)portals.Count;
      portals.Array[uVar17].Frac = dVar28;
      pSVar14[uVar17].topslope = dVar13;
      (&pSVar14[uVar17].topslope)[1] = dVar26;
      pSVar14[uVar17].direction = iVar20;
      pSVar14[uVar17].portalgroup = iVar4;
      portals.Count = portals.Count + 1;
    }
LAB_00450099:
    bVar15 = false;
  }
  else {
LAB_00450537:
    bVar15 = true;
  }
  return bVar15;
}

Assistant:

bool SightCheck::PTR_SightTraverse (intercept_t *in)
{
	line_t  *li;
	double slope;
	SightOpening open;
	int  frontflag = -1;

	li = in->d.line;

//
// crosses a two sided line
//

	// ignore self referencing sectors if COMPAT_TRACE is on
	if ((i_compatflags & COMPATF_TRACE) && li->frontsector == li->backsector) 
		return true;

	double trX = Trace.x + Trace.dx * in->frac;
	double trY = Trace.y + Trace.dy * in->frac;
	P_SightOpening (open, li, trX, trY);

	FLinePortal *lport = li->getPortal();

	if (open.range == 0 && open.portalflags == 0 && (lport == NULL || lport->mType != PORTT_LINKED))		// quick test for totally closed doors (must be delayed if portal checks are needed, though)
		return false;		// stop

	if (in->frac == 0)
		return true;

	// check bottom
	if (open.bottom > LINEOPEN_MIN)
	{
		slope = (open.bottom - sightstart.Z) / in->frac;
		if (slope > bottomslope)
			bottomslope = slope;
	}

	// check top
	if (open.top < LINEOPEN_MAX)
	{
		slope = (open.top - sightstart.Z) / in->frac;
		if (slope < topslope)
			topslope = slope;
	}

	if (open.portalflags)
	{
		sector_t *frontsec, *backsec;
		frontflag = P_PointOnLineSidePrecise(sightstart, li);
		if (!frontflag)
		{
			frontsec = li->frontsector;
			backsec = li->backsector;
		}
		else
		{
			frontsec = li->backsector;
			if (!frontsec) return false;	// We are looking through the backside of a one-sided line. Just abort if that happens.
			backsec = li->frontsector;
			open.SwapSides();				// swap flags to make the next checks simpler.
		}

		if (portaldir != sector_t::floor && (open.portalflags & SO_TOPBACK) && !(open.portalflags & SO_TOPFRONT))
		{
			portals.Push({ in->frac, topslope, bottomslope, sector_t::ceiling, backsec->GetOppositePortalGroup(sector_t::ceiling) });
		}
		if (portaldir != sector_t::ceiling && (open.portalflags & SO_BOTTOMBACK) && !(open.portalflags & SO_BOTTOMFRONT))
		{
			portals.Push({ in->frac, topslope, bottomslope, sector_t::floor, backsec->GetOppositePortalGroup(sector_t::floor) });
		}
	}
	if (lport)
	{
		portals.Push({ in->frac, topslope, bottomslope, portaldir, lport->mDestination->frontsector->PortalGroup });
		return false;
	}

	if (topslope <= bottomslope || open.range == 0)
		return false;		// stop

	// now handle 3D-floors
	if(li->frontsector->e->XFloor.ffloors.Size() || li->backsector->e->XFloor.ffloors.Size())
	{
		if (frontflag == -1) frontflag = P_PointOnLineSidePrecise(sightstart, li);
		
		//Check 3D FLOORS!
		for(int i=1;i<=2;i++)
		{
			sector_t * s=i==1? li->frontsector:li->backsector;
			double    highslope, lowslope;

			double topz= topslope * in->frac + sightstart.Z;
			double bottomz= bottomslope * in->frac + sightstart.Z;

			for (auto rover : s->e->XFloor.ffloors)
			{
				if ((rover->flags & FF_SEETHROUGH) == myseethrough || !(rover->flags & FF_EXISTS)) continue;
				if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

				double ff_bottom = rover->bottom.plane->ZatPoint(trX, trY);
				double ff_top = rover->top.plane->ZatPoint(trX, trY);

				highslope = (ff_top - sightstart.Z) / in->frac;
				lowslope = (ff_bottom - sightstart.Z) / in->frac;

				if (highslope >= topslope)
				{
					// blocks completely
					if (lowslope <= bottomslope) return false;
					// blocks upper edge of view
					if (lowslope < topslope) topslope = lowslope;
				}
				else if (lowslope <= bottomslope)
				{
					// blocks lower edge of view
					if (highslope > bottomslope)  bottomslope = highslope;
				}
				else
				{
					// the 3D-floor is inside the viewing cone but neither clips the top nor the bottom so by 
					// itself it can't be view blocking.
					// However, if there's a 3D-floor on the other side that obstructs the same vertical range
					// the 2 together will block sight.
					sector_t * sb = i == 2 ? li->frontsector : li->backsector;

					for (auto rover2 : sb->e->XFloor.ffloors)
					{
						if ((rover2->flags & FF_SEETHROUGH) == myseethrough || !(rover2->flags & FF_EXISTS)) continue;
						if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

						double ffb_bottom = rover2->bottom.plane->ZatPoint(trX, trY);
						double ffb_top = rover2->top.plane->ZatPoint(trX, trY);

						if ((ffb_bottom >= ff_bottom && ffb_bottom <= ff_top) ||
							(ffb_top <= ff_top && ffb_top >= ff_bottom) ||
							(ffb_top >= ff_top && ffb_bottom <= ff_bottom) ||
							(ffb_top <= ff_top && ffb_bottom >= ff_bottom))
						{
							return false;
						}
					}
				}
				// trace is leaving a sector with a 3d-floor
				if (s == lastsector && frontflag == i - 1)
				{
					// upper slope intersects with this 3d-floor
					if (Lastztop <= ff_bottom && topz > ff_top)
					{
						topslope = lowslope;
					}
					// lower slope intersects with this 3d-floor
					if (Lastzbottom >= ff_top && bottomz < ff_top)
					{
						bottomslope = highslope;
					}
				}
				if (topslope <= bottomslope) return false;		// stop
			}
		}
		lastsector = frontflag==0 ? li->backsector : li->frontsector;
	}
	else lastsector=NULL;	// don't need it if there are no 3D-floors

	Lastztop = (topslope * in->frac) + sightstart.Z;
	Lastzbottom = (bottomslope * in->frac) + sightstart.Z;

	return true;			// keep going
}